

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s-hierarchy-trainer-CH.cc
# Opt level: O1

void ReadSentencePair(string *line,vector<int,_std::allocator<int>_> *s,Dict *sd,
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *c,Dict *cd,
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *l,Dict *ld,int *unk,int *total)

{
  vector<int,_std::allocator<int>_> *this;
  byte bVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pvVar4;
  iterator iVar5;
  size_type sVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  size_type __new_size;
  string sep;
  istringstream in;
  int local_20c;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_208;
  string local_200;
  Dict *local_1e0;
  Dict *local_1d8;
  undefined1 *local_1d0;
  size_t local_1c8;
  undefined1 local_1c0 [16];
  long local_1b0 [4];
  byte abStack_190 [88];
  ios_base local_138 [264];
  
  local_208 = l;
  local_1e0 = cd;
  local_1d8 = sd;
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)line,_S_in);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  local_200._M_string_length = 0;
  local_200.field_2._M_local_buf[0] = '\0';
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"|||","");
  if ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) == 0) {
    uVar10 = 0;
    do {
      while( true ) {
        std::operator>>((istream *)local_1b0,(string *)&local_200);
        sVar6 = local_200._M_string_length;
        if ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) != 0) goto LAB_0016255e;
        if ((local_200._M_string_length == local_1c8) &&
           ((local_200._M_string_length == 0 ||
            (iVar7 = bcmp(local_200._M_dataplus._M_p,local_1d0,local_200._M_string_length),
            iVar7 == 0)))) break;
        if (uVar10 == 0) {
          *total = *total + 1;
          if (sVar6 != 0) {
            uVar8 = 1;
            uVar9 = 0;
            do {
              bVar1 = local_200._M_dataplus._M_p[uVar9];
              bVar11 = 0x30;
              if ((byte)(bVar1 - 0x30) < 10) {
LAB_001626d0:
                local_200._M_dataplus._M_p[uVar9] = bVar11;
              }
              else if ((byte)(bVar1 + 0xbf) < 0x1a) {
                bVar11 = bVar1 | 0x20;
                goto LAB_001626d0;
              }
              uVar9 = (ulong)uVar8;
              uVar8 = uVar8 + 1;
            } while (uVar9 < local_200._M_string_length);
          }
          local_20c = cnn::Dict::Convert(local_1d8,&local_200);
          if (local_20c == kUNK) {
            *unk = *unk + 1;
          }
          iVar5._M_current =
               (s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
          if (iVar5._M_current ==
              (s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)s,iVar5,&local_20c);
          }
          else {
            *iVar5._M_current = local_20c;
            (s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar5._M_current + 1;
          }
        }
        else {
          __new_size = (long)(s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start >> 2;
          if (__new_size < uVar10) {
            if (__new_size + 1 == uVar10) {
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::resize(local_208,__new_size);
            }
            piVar2 = (s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            piVar3 = (s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pvVar4 = (local_208->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_20c = cnn::Dict::Convert(ld,&local_200);
            this = pvVar4 + ((ulong)~((long)piVar2 - (long)piVar3) >> 2) + uVar10;
            iVar5._M_current =
                 (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this,iVar5,&local_20c);
            }
            else {
              *iVar5._M_current = local_20c;
              (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_finish = iVar5._M_current + 1;
            }
          }
          else {
            if (uVar10 == 1) {
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::resize(c,__new_size);
            }
            pvVar4 = (c->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_20c = cnn::Dict::Convert(local_1e0,&local_200);
            iVar5._M_current =
                 *(pointer *)
                  ((long)&pvVar4[uVar10 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
            if (iVar5._M_current ==
                *(pointer *)
                 ((long)&pvVar4[uVar10 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + 0x10)) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (pvVar4 + (uVar10 - 1),iVar5,&local_20c);
            }
            else {
              *iVar5._M_current = local_20c;
              *(int **)((long)&pvVar4[uVar10 - 1].super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data + 8) = iVar5._M_current + 1;
            }
          }
        }
        if ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) != 0) goto LAB_0016255e;
      }
      uVar10 = uVar10 + 1;
    } while ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) == 0);
  }
LAB_0016255e:
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void ReadSentencePair(const string& line, vector<int>* s, cnn::Dict* sd, vector< vector<int> >& c, cnn::Dict* cd, vector< vector<int> >& l, cnn::Dict* ld, int& unk, int& total){
  istringstream in(line);
  string word;
  string sep = "|||";
  int f = 0;

  while(in) {
    in >> word;
    if (!in) break;

    if (word == sep) { f+=1; continue; }
    
    if(f == 0) {
      total += 1;
      normalize_digital_lower(word);
      int k = sd->Convert(word);
      if(k == kUNK) unk++;
      s->push_back(k);
    }
    else if( f <= s->size()){
       if(f == 1) c.resize(s->size());
       c[f-1].push_back(cd->Convert(word));
    }
    else {
      if(f == s->size()+1) l.resize(s->size());
      l[f-(s->size())-1].push_back(ld->Convert(word));
    }
  }
}